

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MarkContext.h
# Opt level: O3

void __thiscall Memory::MarkContext::Cleanup(MarkContext *this)

{
  undefined4 *puVar1;
  code *pcVar2;
  bool bVar3;
  PagePool *this_00;
  undefined8 *in_FS_OFFSET;
  
  bVar3 = PageStack<Memory::MarkContext::MarkCandidate>::IsEmpty(&this->markStack);
  if (bVar3) {
    bVar3 = PageStack<FinalizableObject_*>::IsEmpty(&this->trackStack);
    if (!bVar3) goto LAB_00277cf6;
  }
  else {
LAB_00277cf6:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                       ,0x67,"(!HasPendingObjects())","!HasPendingObjects()");
    if (!bVar3) goto LAB_00277db2;
    *puVar1 = 0;
  }
  this_00 = this->pagePool;
  if ((this_00->pageAllocator).disableAllocationOutOfMemory == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar1 = (undefined4 *)*in_FS_OFFSET;
    *puVar1 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/MarkContext.h"
                       ,0x68,"(!GetPageAllocator()->DisableAllocationOutOfMemory())",
                       "!GetPageAllocator()->DisableAllocationOutOfMemory()");
    if (!bVar3) {
LAB_00277db2:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar1 = 0;
    this_00 = this->pagePool;
  }
  PagePool::ReleaseFreePages(this_00);
  return;
}

Assistant:

void Cleanup()
    {
        Assert(!HasPendingObjects());
        Assert(!GetPageAllocator()->DisableAllocationOutOfMemory());
        this->pagePool->ReleaseFreePages();
    }